

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos1,size_type n1,
          char *s)

{
  basic_string_view<char,_std::char_traits<char>_> other;
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  const_pointer local_48;
  size_type local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  char *local_28;
  char *s_local;
  size_type n1_local;
  size_type pos1_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  
  local_28 = s;
  s_local = (char *)n1;
  n1_local = pos1;
  pos1_local = (size_type)this;
  local_38 = substr(this,pos1,n1);
  basic_string_view(&local_58,local_28);
  local_48 = local_58.data_;
  local_40 = local_58.size_;
  other.size_ = local_58.size_;
  other.data_ = local_58.data_;
  iVar1 = compare(&local_38,other);
  return iVar1;
}

Assistant:

nssv_constexpr int compare( size_type pos1, size_type n1, CharT const * s ) const // (5)
    {
        return substr( pos1, n1 ).compare( basic_string_view( s ) );
    }